

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O0

bool __thiscall
HighsTransformedLp::untransform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<int,_std::allocator<int>_> *inds,double *rhs,bool integral)

{
  value_type vVar1;
  HighsInt HVar2;
  HighsMipSolver *this_00;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  pointer pHVar8;
  double *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  double dVar9;
  HighsInt i_2;
  HighsInt i_1;
  anon_class_24_3_35271421 IsZero_1;
  bool abort;
  anon_class_1_0_00000001 IsZero;
  HighsInt j_1;
  double *rowvals_1;
  HighsInt *rowinds_1;
  HighsInt rowlen_1;
  HighsInt row_1;
  HighsInt j;
  double *rowvals;
  HighsInt *rowinds;
  HighsInt rowlen;
  HighsInt row;
  HighsInt col;
  HighsInt i;
  HighsInt numNz;
  HighsInt slackOffset;
  HighsMipSolver *mip;
  HighsCDouble tmpRhs;
  undefined4 in_stack_fffffffffffffe48;
  HighsInt in_stack_fffffffffffffe4c;
  HighsSparseVectorSum *in_stack_fffffffffffffe50;
  HighsSparseVectorSum *this_01;
  HighsInt **in_stack_fffffffffffffe58;
  HighsCDouble *in_stack_fffffffffffffe60;
  HighsLpRelaxation *in_stack_fffffffffffffe68;
  HighsLpRelaxation *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  HighsInt in_stack_fffffffffffffe7c;
  HighsSparseVectorSum *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int iVar10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int local_b8;
  int local_b4;
  int local_94;
  long local_88;
  int local_7c;
  int local_74;
  int local_60;
  int local_54;
  HighsCDouble local_40;
  byte local_29;
  double *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsCDouble::HighsCDouble(&local_40,*in_RCX);
  this_00 = HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
  HVar2 = HighsMipSolver::numCol(this_00);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_20);
  for (local_54 = 0; local_54 != (int)sVar3; local_54 = local_54 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_54);
      iVar10 = *pvVar5;
      pvVar6 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)iVar10);
      switch(*pvVar6) {
      case kSimpleUb:
        if (iVar10 < HVar2) {
          std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
          pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6b2e0f);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(pHVar8->domain).col_upper_,(long)iVar10);
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe50,
                     (double)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
          HighsSparseVectorSum::add
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     (double)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffea4 = iVar10;
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54)
          ;
          in_stack_fffffffffffffe80 = (HighsSparseVectorSum *)*pvVar4;
          HighsLpRelaxation::slackUpper
                    (in_stack_fffffffffffffe68,(HighsInt)((ulong)in_stack_fffffffffffffe60 >> 0x20))
          ;
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe50,
                     (double)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54)
          ;
          vVar1 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54)
          ;
          *pvVar4 = -vVar1;
          HighsLpRelaxation::getRow
                    (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (HighsInt *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe50);
          for (local_94 = 0; local_94 != local_7c; local_94 = local_94 + 1) {
            in_stack_fffffffffffffe70 = (HighsLpRelaxation *)(in_RDI + 0x19);
            in_stack_fffffffffffffe7c = *(HighsInt *)(local_88 + (long)local_94 * 4);
            std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
            HighsSparseVectorSum::add
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       (double)in_stack_fffffffffffffe70);
          }
        }
        break;
      case kSimpleLb:
        if (iVar10 < HVar2) {
          std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
          pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6b2c08);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(pHVar8->domain).col_lower_,(long)iVar10);
          HighsCDouble::operator+=(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
          std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
          HighsSparseVectorSum::add
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     (double)in_stack_fffffffffffffe70);
        }
        else {
          std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
          HighsLpRelaxation::slackLower
                    ((HighsLpRelaxation *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (HighsInt)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          HighsCDouble::operator+=(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
          HighsLpRelaxation::getRow
                    (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (HighsInt *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe50);
          for (local_74 = 0; local_74 != local_60; local_74 = local_74 + 1) {
            std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
            HighsSparseVectorSum::add
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       (double)in_stack_fffffffffffffe70);
          }
        }
        break;
      case kVariableUb:
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 1),(long)iVar10);
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        HighsCDouble::operator-=
                  ((HighsCDouble *)in_stack_fffffffffffffe50,
                   (double)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        in_stack_fffffffffffffee8 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x19);
        pvVar7 = std::
                 vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                               *)(in_RDI + 1),(long)iVar10);
        in_stack_fffffffffffffef4 = pvVar7->first;
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 1),(long)iVar10);
        HighsSparseVectorSum::add
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (double)in_stack_fffffffffffffe70);
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        HighsSparseVectorSum::add
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (double)in_stack_fffffffffffffe70);
        break;
      case kVariableLb:
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 4),(long)iVar10);
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        HighsCDouble::operator+=(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 4),(long)iVar10);
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 4),(long)iVar10);
        HighsSparseVectorSum::add
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (double)in_stack_fffffffffffffe70);
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_54);
        HighsSparseVectorSum::add
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (double)in_stack_fffffffffffffe70);
      }
    }
  }
  if ((local_29 & 1) == 0) {
    HighsSparseVectorSum::
    cleanup<HighsTransformedLp::untransform(std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,double&,bool)::__1&>
              (in_stack_fffffffffffffe80,
               (anon_class_24_3_35271421 *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    dVar9 = HighsCDouble::operator_cast_to_double(&local_40);
    *local_28 = dVar9;
  }
  else {
    HighsSparseVectorSum::
    cleanup<HighsTransformedLp::untransform(std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,double&,bool)::__0&>
              (in_stack_fffffffffffffe80,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    dVar9 = HighsCDouble::operator_cast_to_double(&local_40);
    dVar9 = round(dVar9);
    *local_28 = dVar9;
  }
  HighsSparseVectorSum::getNonzeros((HighsSparseVectorSum *)(in_RDI + 0x19));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_20);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70,
             (size_type)in_stack_fffffffffffffe68);
  if ((local_29 & 1) == 0) {
    for (local_b8 = 0; local_b8 != (int)sVar3; local_b8 = local_b8 + 1) {
      this_01 = (HighsSparseVectorSum *)(in_RDI + 0x19);
      std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_b8);
      dVar9 = HighsSparseVectorSum::getValue(this_01,in_stack_fffffffffffffe4c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_b8);
      *pvVar4 = dVar9;
    }
  }
  else {
    for (local_b4 = 0; local_b4 != (int)sVar3; local_b4 = local_b4 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_b4);
      dVar9 = HighsSparseVectorSum::getValue(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      dVar9 = round(dVar9);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_b4);
      *pvVar4 = dVar9;
    }
  }
  HighsSparseVectorSum::clear
            ((HighsSparseVectorSum *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  return true;
}

Assistant:

bool HighsTransformedLp::untransform(std::vector<double>& vals,
                                     std::vector<HighsInt>& inds, double& rhs,
                                     bool integral) {
  HighsCDouble tmpRhs = rhs;
  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = mip.numCol();

  HighsInt numNz = inds.size();

  for (HighsInt i = 0; i != numNz; ++i) {
    if (vals[i] == 0.0) continue;
    HighsInt col = inds[i];

    switch (boundTypes[col]) {
      case BoundType::kVariableLb: {
        tmpRhs += bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, -vals[i] * bestVlb[col].second.coef);
        vectorsum.add(col, vals[i]);
        break;
      }
      case BoundType::kVariableUb: {
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vectorsum.add(col, -vals[i]);
        break;
      }
      case BoundType::kSimpleLb: {
        if (col < slackOffset) {
          tmpRhs += vals[i] * mip.mipdata_->domain.col_lower_[col];
          vectorsum.add(col, vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs += vals[i] * lprelaxation.slackLower(row);

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
        break;
      }
      case BoundType::kSimpleUb: {
        if (col < slackOffset) {
          tmpRhs -= vals[i] * mip.mipdata_->domain.col_upper_[col];
          vectorsum.add(col, -vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs -= vals[i] * lprelaxation.slackUpper(row);
          vals[i] = -vals[i];

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
      }
    }
  }

  if (integral) {
    // if the cut is integral, we just round all coefficient values and the
    // right hand side to the nearest integral value, as small deviation
    // only come from numerical errors during resubstitution of slack variables

    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      return fabs(val) < 0.5;
    };

    vectorsum.cleanup(IsZero);
    rhs = std::round(double(tmpRhs));
  } else {
    bool abort = false;
    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      double absval = std::abs(val);
      if (absval <= mip.options_mip_->small_matrix_value) return true;

      if (absval <= mip.mipdata_->feastol) {
        if (val > 0) {
          if (mip.mipdata_->domain.col_lower_[col] == -kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_lower_[col];
        } else {
          if (mip.mipdata_->domain.col_upper_[col] == kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_upper_[col];
        }
        return true;
      }
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (abort) {
      vectorsum.clear();
      return false;
    }
    rhs = double(tmpRhs);
  }

  inds = vectorsum.getNonzeros();
  numNz = inds.size();
  vals.resize(numNz);

  if (integral)
    for (HighsInt i = 0; i != numNz; ++i)
      vals[i] = std::round(vectorsum.getValue(inds[i]));
  else
    for (HighsInt i = 0; i != numNz; ++i) vals[i] = vectorsum.getValue(inds[i]);
  vectorsum.clear();

  return true;
}